

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

VarConcat * __thiscall kratos::Var::concat(Var *this,Var *var)

{
  VarConcat *pVVar1;
  pointer ppVVar2;
  shared_ptr<kratos::VarConcat> *exist_var;
  pointer psVar3;
  undefined1 local_50 [8];
  shared_ptr<kratos::VarConcat> concat_ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  psVar3 = (this->concat_vars_).
           super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar3 == (this->concat_vars_).
                  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                 &concat_ptr.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<kratos::Var>);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                (local_30,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                          &var->super_enable_shared_from_this<kratos::Var>);
      std::make_shared<kratos::VarConcat,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
                ((shared_ptr<kratos::Var> *)local_50,
                 (shared_ptr<kratos::Var> *)
                 &concat_ptr.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      std::
      vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
      ::emplace_back<std::shared_ptr<kratos::VarConcat>&>
                ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                  *)&this->concat_vars_,(shared_ptr<kratos::VarConcat> *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&concat_ptr);
      return (VarConcat *)local_50;
    }
    pVVar1 = (psVar3->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppVVar2 = (pVVar1->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (((long)ppVVar2 -
         (long)(pVVar1->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x10) && (ppVVar2[-1] == var)) break;
    psVar3 = psVar3 + 1;
  }
  return pVVar1;
}

Assistant:

VarConcat &Var::concat(Var &var) {
    auto *ptr = &var;
    // notice that we effectively created an implicit sink->sink by creating a concat
    // however, it's not an assignment, that's why we need to use concat_vars to hold the
    // vars
    for (auto const &exist_var : concat_vars_) {
        // reuse the existing variables
        if (exist_var->vars().size() == 2 && exist_var->vars().back() == ptr) {
            return *exist_var;
        }
    }
    auto concat_ptr = std::make_shared<VarConcat>(shared_from_this(), ptr->shared_from_this());
    concat_vars_.emplace_back(concat_ptr);
    return *concat_ptr;
}